

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O3

t_pvalue __thiscall
xemmai::
t_overload<xemmai::t_construct<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>::
t_bind<t_queue>::f_do(t_bind<t_queue> *this,t_type *a_class,t_pvalue *a_stack,size_t a_n)

{
  t_object *ptVar1;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  t_pvalue tVar2;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_18;
  
  if ((((a_n == 1) && (ptVar1 = a_stack[2].super_t_pointer.v_p, (t_object *)0x4 < ptVar1)) &&
      (ptVar1->v_type->v_depth != 0)) &&
     ((undefined8 *)ptVar1->v_type->v_ids[1] == &v__type_id<xemmai::t_string>)) {
    local_18._M_len = *(size_t *)ptVar1->v_data;
    local_18._M_str = (wchar_t *)(ptVar1->v_data + 8);
    ptVar1 = t_type_of<xemmai::t_object>::
             f_new<t_queue,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                       (a_class,&local_18);
    *(t_object **)this = ptVar1;
    tVar2.field_0.v_integer = extraout_RDX.v_integer;
    tVar2.super_t_pointer.v_p = (t_object *)this;
    return tVar2;
  }
  xemmai::f_throw(0x26,L"no method matching signature is found.");
}

Assistant:

static bool f_match(t_pvalue* a_stack, size_t a_n)
	{
		return a_n == sizeof...(T_an) && f_match(a_stack + 2, std::index_sequence_for<T_an...>());
	}